

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmain_test.cpp
# Opt level: O2

pint p_test_case_pmain_vtable_test(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  char *__s1;
  PMemVTable vtable;
  
  p_test_module_fail_counter = 0;
  p_libsys_init_full();
  alloc_counter = 0;
  realloc_counter = 0;
  free_counter = 0;
  uVar2 = p_malloc0(10);
  lVar3 = p_realloc(uVar2,0x14);
  if (lVar3 != 0) {
    p_free(lVar3);
    if (alloc_counter < 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pmain_test.cpp"
             ,0x5f);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    if (realloc_counter < 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pmain_test.cpp"
             ,0x60);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    if (free_counter < 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pmain_test.cpp"
             ,0x61);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    __s1 = (char *)p_libsys_version();
    iVar1 = strcmp(__s1,"0.0.5");
    if (iVar1 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pmain_test.cpp"
             ,99);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_libsys_shutdown();
    return -(uint)(p_test_module_fail_counter != 0);
  }
  printf("%s:%d: required check failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pmain_test.cpp"
         ,0x59);
  exit(-1);
}

Assistant:

P_TEST_CASE_BEGIN (pmain_vtable_test)
{
	PMemVTable	vtable;

	vtable.f_free    = pmem_free;
	vtable.f_malloc  = pmem_alloc;
	vtable.f_realloc = pmem_realloc;

	p_libsys_init_full (&vtable);

	alloc_counter   = 0;
	realloc_counter = 0;
	free_counter    = 0;

	pchar *buf = (pchar *) p_malloc0 (10);
	pchar *new_buf = (pchar *) p_realloc ((ppointer) buf, 20);

	P_TEST_REQUIRE (new_buf != NULL);

	buf = new_buf;

	p_free (buf);

	P_TEST_CHECK (alloc_counter > 0);
	P_TEST_CHECK (realloc_counter > 0);
	P_TEST_CHECK (free_counter > 0);

	P_TEST_CHECK (strcmp (p_libsys_version (), PLIBSYS_VERSION_STR) == 0);

	p_libsys_shutdown ();
}